

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O3

bool __thiscall
wasm::anon_unknown_0::ModuleAnalyzer::canChangeState
          (ModuleAnalyzer *this,Expression *curr,Function *func)

{
  byte bVar1;
  byte bVar2;
  mapped_type *pmVar3;
  Expression **ppEVar4;
  undefined1 auStack_138 [8];
  Walker walker;
  Expression *local_38;
  Expression *curr_local;
  Function *func_local;
  
  auStack_138 = (undefined1  [8])0x0;
  walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.replacep = (Expression **)0x0;
  walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.fixed._M_elems[9].currp =
       (Expression **)0x0;
  walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.currFunction = (Function *)0x0;
  walker.map._0_1_ = '\0';
  walker.map._1_1_ = 0;
  walker.map._2_1_ = 0;
  walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.currModule = this->module;
  walker.module = (Module *)this;
  walker.analyzer = (ModuleAnalyzer *)&this->map;
  local_38 = curr;
  curr_local = (Expression *)func;
  Walker<Walker,_wasm::Visitor<Walker,_void>_>::pushTask
            ((Walker<Walker,_wasm::Visitor<Walker,_void>_> *)auStack_138,
             PostWalker<Walker,_wasm::Visitor<Walker,_void>_>::scan,&local_38);
  if (((long)walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
             super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
             super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.fixed._M_elems[9].currp >> 4)
      + (long)walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
              super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.replacep != 0) {
    do {
      if ((pointer)walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                   super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.fixed._M_elems[9].currp
          == walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
             super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start) {
        if (walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
            super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.replacep == (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,
                        "T &wasm::SmallVector<wasm::Walker<Walker, wasm::Visitor<Walker>>::Task, 10>::back() [T = wasm::Walker<Walker, wasm::Visitor<Walker>>::Task, N = 10]"
                       );
        }
        ppEVar4 = walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                  super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.fixed._M_elems
                  [(long)walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                         super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.replacep + -2].currp;
        auStack_138 = (undefined1  [8])
                      walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                      super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.fixed._M_elems
                      [(long)walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                             super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.replacep + -1].func;
        walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
        super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.replacep =
             (Expression **)
             ((long)walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                    super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.replacep + -1);
      }
      else {
        ppEVar4 = (Expression **)
                  walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                  super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
                  super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
                  ._M_impl.super__Vector_impl_data._M_start[-1].func;
        auStack_138 = (undefined1  [8])
                      walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                      super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
                      super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].currp;
        walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
        super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
             super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      if (*(Expression **)auStack_138 == (Expression *)0x0) {
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,
                      "void wasm::Walker<Walker, wasm::Visitor<Walker>>::walk(Expression *&) [SubType = Walker, VisitorType = wasm::Visitor<Walker>]"
                     );
      }
      (*(code *)ppEVar4)((Walker_conflict *)auStack_138,(Expression **)auStack_138);
    } while (((long)walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                    super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
                    super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                    super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.fixed._M_elems[9].currp
             >> 4) + (long)walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                           super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.replacep != 0);
  }
  if ((char)walker.map == '\x01') {
    if (this->canIndirectChangeState == false) {
      pmVar3 = std::
               map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
               ::operator[](&this->map,(key_type *)&curr_local);
      if (pmVar3->addedFromList != true) goto LAB_007afd61;
    }
    walker.map._1_1_ = 1;
  }
LAB_007afd61:
  bVar2 = walker.map._2_1_;
  bVar1 = walker.map._1_1_;
  if (walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
      super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.fixed._M_elems[9].currp !=
      (Expression **)0x0) {
    operator_delete(walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                    super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.fixed._M_elems[9].currp
                    ,(long)walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                           super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
                           super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                           super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.fixed._M_elems
                           [9].currp);
  }
  return (bool)(bVar1 & (bVar2 ^ 1));
}

Assistant:

bool canChangeState(Expression* curr, Function* func) {
    // Look inside to see if we call any of the things we know can change the
    // state.
    // TODO: caching, this is O(N^2)
    struct Walker : PostWalker<Walker> {
      void visitCall(Call* curr) {
        // We only implement these at the very end, but we know that they
        // definitely change the state.
        if (curr->target == ASYNCIFY_START_UNWIND ||
            curr->target == ASYNCIFY_STOP_REWIND ||
            curr->target == ASYNCIFY_GET_CALL_INDEX ||
            curr->target == ASYNCIFY_CHECK_CALL_INDEX) {
          canChangeState = true;
          return;
        }
        if (curr->target == ASYNCIFY_STOP_UNWIND ||
            curr->target == ASYNCIFY_START_REWIND) {
          isBottomMostRuntime = true;
          return;
        }
        // The target may not exist if it is one of our temporary intrinsics.
        auto* target = module->getFunctionOrNull(curr->target);
        if (target && (*map)[target].canChangeState) {
          canChangeState = true;
        }
      }
      void visitCallIndirect(CallIndirect* curr) { hasIndirectCall = true; }
      Module* module;
      ModuleAnalyzer* analyzer;
      Map* map;
      bool hasIndirectCall = false;
      bool canChangeState = false;
      bool isBottomMostRuntime = false;
    };
    Walker walker;
    walker.module = &module;
    walker.analyzer = this;
    walker.map = &map;
    walker.walk(curr);
    // An indirect call is normally ignored if we are ignoring indirect calls.
    // However, see the docs at the top: if the function we are inside was
    // specifically added by the user (in the only-list or the add-list) then we
    // instrument indirect calls from it (this allows specifically allowing some
    // indirect calls but not others).
    if (walker.hasIndirectCall &&
        (canIndirectChangeState || map[func].addedFromList)) {
      walker.canChangeState = true;
    }
    // The bottom-most runtime can never change the state.
    return walker.canChangeState && !walker.isBottomMostRuntime;
  }